

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O1

void __thiscall adios2::core::engine::BP4Reader::DoClose(BP4Reader *this,int transportIndex)

{
  int iVar1;
  undefined4 in_register_00000034;
  ScopedTimer __var2846;
  string local_80;
  string local_60;
  string local_40;
  
  if (DoClose(int)::__var846 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var846,
                                CONCAT44(in_register_00000034,transportIndex));
    if (iVar1 != 0) {
      DoClose::__var846 = (void *)ps_timer_create_("BP4Reader::Close");
      __cxa_guard_release(&DoClose(int)::__var846);
    }
  }
  __var2846.m_timer = DoClose::__var846;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Engine","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"BP4Reader","");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Close","");
  iVar1 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_40,&local_60,&local_80,&(this->super_Engine).m_Name,0,iVar1,5,this->m_Verbosity
              ,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  PerformGets(this);
  Engine::RemoveCreatedVars(&this->super_Engine);
  transportman::TransportMan::CloseFiles(&this->m_DataFileManager,-1);
  transportman::TransportMan::CloseFiles(&this->m_MDFileManager,-1);
  transportman::TransportMan::CloseFiles(&this->m_MDIndexFileManager,-1);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2846);
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}